

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O2

error<idx2::mmap_err_code> idx2::FlushFile(mmap_file *MMap,byte *Start,i64 Bytes)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  bool bVar4;
  error<idx2::mmap_err_code> eVar5;
  
  if (Start == (byte *)0x0) {
    Start = (MMap->Buf).Data;
    if (Bytes == 0) {
      Bytes = (MMap->Buf).Bytes;
    }
  }
  else if (Bytes == 0) {
    Bytes = (i64)((MMap->Buf).Data + ((MMap->Buf).Bytes - (long)Start));
  }
  iVar2 = msync(Start,Bytes,1);
  lVar1 = *in_FS_OFFSET;
  bVar4 = iVar2 != -1;
  *(char **)(*in_FS_OFFSET + -0x480) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
  ;
  *(uint *)(lVar1 + -0x280) = bVar4 + 0x8b + (uint)bVar4;
  uVar3 = 0x18;
  if (bVar4) {
    uVar3 = 0;
  }
  eVar5.Code = (int)uVar3;
  eVar5.StackIdx = (char)((ulong)uVar3 >> 0x20);
  eVar5.StrGened = (bool)(char)((ulong)uVar3 >> 0x28);
  eVar5._14_2_ = (short)((ulong)uVar3 >> 0x30);
  eVar5.Msg = "";
  return eVar5;
}

Assistant:

error<mmap_err_code>
FlushFile(mmap_file* MMap, byte* Start, i64 Bytes)
{
#if defined(_WIN32)
  bool Result =
    Start ? FlushViewOfFile(Start, (size_t)Bytes) : FlushViewOfFile(MMap->Buf.Data, (size_t)Bytes);
  if (!Result)
    return idx2_Error(mmap_err_code::FlushFailed);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  int Result;
  if (Start)
  {
    idx2_Assert(MMap->Buf.Data <= Start && Start < MMap->Buf.Data + MMap->Buf.Bytes);
    idx2_Assert(Bytes <= (MMap->Buf.Data + MMap->Buf.Bytes) - Start);
    Result = Bytes ? msync(Start, Bytes, MS_ASYNC)
                   : msync(Start, MMap->Buf.Bytes - (Start - MMap->Buf.Data), MS_ASYNC);
  }
  else
  {
    idx2_Assert(Bytes <= MMap->Buf.Bytes);
    Result = Bytes ? msync(MMap->Buf.Data, Bytes, MS_ASYNC)
                   : msync(MMap->Buf.Data, MMap->Buf.Bytes, MS_ASYNC);
  }
  if (Result == -1)
    return idx2_Error(mmap_err_code::FlushFailed);
#endif
  return idx2_Error(mmap_err_code::NoError);
}